

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borromean_impl.h
# Opt level: O3

int secp256k1_borromean_sign
              (secp256k1_ecmult_context *ecmult_ctx,secp256k1_ecmult_gen_context *ecmult_gen_ctx,
              uchar *e0,secp256k1_scalar *s,secp256k1_gej *pubs,secp256k1_scalar *k,
              secp256k1_scalar *sec,size_t *rsizes,size_t *secidx,size_t nrings,uchar *m,size_t mlen
              )

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  uint uVar36;
  int iVar37;
  ulong uVar38;
  ulong uVar39;
  ulong *puVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  uchar *data;
  secp256k1_gej *psVar47;
  size_t sVar48;
  secp256k1_scalar *psVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  ulong uVar56;
  ulong uVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  secp256k1_ecmult_gen_context *psVar61;
  undefined1 auVar62 [16];
  int overflow;
  secp256k1_scalar ens;
  uint64_t l [8];
  uchar tmp [33];
  secp256k1_gej rgej;
  secp256k1_ge rge;
  int local_2a4;
  uint local_2a0;
  uint local_29c;
  secp256k1_scalar *local_298;
  long local_290;
  size_t local_288;
  secp256k1_ecmult_gen_context *local_280;
  size_t local_278;
  uchar *local_270;
  secp256k1_scalar *local_268;
  secp256k1_ecmult_context *local_260;
  secp256k1_scalar *local_258;
  secp256k1_gej *local_250;
  secp256k1_gej *local_248;
  secp256k1_scalar *local_240;
  secp256k1_scalar local_238;
  undefined1 local_218 [96];
  size_t local_1b8;
  uchar local_1a8 [48];
  secp256k1_sha256 local_178;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  local_178.s[0] = 0x6a09e667;
  local_178.s[1] = 0xbb67ae85;
  local_178.s[2] = 0x3c6ef372;
  local_178.s[3] = 0xa54ff53a;
  local_178.s[4] = 0x510e527f;
  local_178.s[5] = 0x9b05688c;
  local_178.s[6] = 0x1f83d9ab;
  local_178.s[7] = 0x5be0cd19;
  local_178.bytes = 0;
  local_280 = ecmult_gen_ctx;
  local_268 = k;
  local_260 = ecmult_ctx;
  if (nrings == 0) {
    secp256k1_sha256_write(&local_178,m,mlen);
    secp256k1_sha256_finalize(&local_178,e0);
  }
  else {
    local_240 = s + 1;
    local_248 = pubs + 1;
    local_290 = 0;
    sVar48 = 0;
    local_270 = e0;
    local_258 = s;
    local_250 = pubs;
    do {
      secp256k1_ecmult_gen(local_280,&local_108,local_268 + sVar48);
      secp256k1_ge_set_gej(&local_88,&local_108);
      if (local_108.infinity != 0) {
        return 0;
      }
      secp256k1_eckey_pubkey_serialize(&local_88,local_1a8,&local_278,1);
      uVar60 = secidx[sVar48] + 1;
      if (uVar60 < rsizes[sVar48]) {
        uVar36 = (uint)sVar48;
        local_288 = CONCAT44(local_288._4_4_,
                             uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                             uVar36 << 0x18);
        lVar46 = secidx[sVar48] + local_290;
        psVar49 = local_240 + lVar46;
        psVar47 = local_248 + lVar46;
        do {
          local_218._0_8_ = 0xbb67ae856a09e667;
          local_218._8_4_ = 0x3c6ef372;
          local_218._12_4_ = 0xa54ff53a;
          local_218._16_4_ = 0x510e527f;
          local_218._20_4_ = 0x9b05688c;
          local_218._24_4_ = 0x1f83d9ab;
          local_218._28_4_ = 0x5be0cd19;
          local_1b8 = 0;
          local_29c = (uint)local_288;
          uVar36 = (uint)uVar60;
          local_2a0 = uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                      uVar36 << 0x18;
          local_298 = psVar49;
          secp256k1_sha256_write((secp256k1_sha256 *)local_218,local_1a8,0x21);
          secp256k1_sha256_write((secp256k1_sha256 *)local_218,m,mlen);
          secp256k1_sha256_write((secp256k1_sha256 *)local_218,(uchar *)&local_29c,4);
          secp256k1_sha256_write((secp256k1_sha256 *)local_218,(uchar *)&local_2a0,4);
          secp256k1_sha256_finalize((secp256k1_sha256 *)local_218,local_1a8);
          secp256k1_scalar_set_b32(&local_238,local_1a8,&local_2a4);
          if (local_2a4 != 0) {
            return 0;
          }
          if ((local_238.d[3] == 0 && local_238.d[1] == 0) &&
              (local_238.d[2] == 0 && local_238.d[0] == 0)) {
            return 0;
          }
          secp256k1_ecmult(local_260,&local_108,psVar47,&local_238,local_298);
          if (local_108.infinity != 0) {
            return 0;
          }
          secp256k1_ge_set_gej_var(&local_88,&local_108);
          psVar49 = local_298;
          secp256k1_eckey_pubkey_serialize(&local_88,local_1a8,&local_278,1);
          uVar60 = uVar60 + 1;
          psVar49 = psVar49 + 1;
          psVar47 = psVar47 + 1;
        } while (uVar60 < rsizes[sVar48]);
      }
      secp256k1_sha256_write(&local_178,local_1a8,local_278);
      local_290 = local_290 + rsizes[sVar48];
      sVar48 = sVar48 + 1;
    } while (sVar48 != nrings);
    secp256k1_sha256_write(&local_178,m,mlen);
    data = local_270;
    secp256k1_sha256_finalize(&local_178,local_270);
    psVar61 = (secp256k1_ecmult_gen_context *)0x0;
    local_288 = 0;
    do {
      local_218._0_8_ = 0xbb67ae856a09e667;
      local_218._8_4_ = 0x3c6ef372;
      local_218._12_4_ = 0xa54ff53a;
      local_218._16_4_ = 0x510e527f;
      local_218._20_4_ = 0x9b05688c;
      local_218._24_4_ = 0x1f83d9ab;
      local_218._28_4_ = 0x5be0cd19;
      local_1b8 = 0;
      uVar36 = (uint)local_288;
      local_29c = uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                  uVar36 << 0x18;
      local_290 = CONCAT44(local_290._4_4_,local_29c);
      local_2a0 = 0;
      secp256k1_sha256_write((secp256k1_sha256 *)local_218,data,0x20);
      secp256k1_sha256_write((secp256k1_sha256 *)local_218,m,mlen);
      secp256k1_sha256_write((secp256k1_sha256 *)local_218,(uchar *)&local_29c,4);
      secp256k1_sha256_write((secp256k1_sha256 *)local_218,(uchar *)&local_2a0,4);
      secp256k1_sha256_finalize((secp256k1_sha256 *)local_218,local_1a8);
      secp256k1_scalar_set_b32(&local_238,local_1a8,&local_2a4);
      if ((local_2a4 != 0) ||
         ((local_238.d[3] == 0 && local_238.d[1] == 0) &&
          (local_238.d[2] == 0 && local_238.d[0] == 0))) {
        return 0;
      }
      psVar49 = local_258 + (long)psVar61;
      psVar47 = local_250 + (long)psVar61;
      uVar60 = 0;
      local_280 = psVar61;
      while (uVar60 < secidx[local_288]) {
        secp256k1_ecmult(local_260,&local_108,psVar47,&local_238,psVar49);
        if (local_108.infinity != 0) {
          return 0;
        }
        local_298 = psVar49;
        secp256k1_ge_set_gej_var(&local_88,&local_108);
        secp256k1_eckey_pubkey_serialize(&local_88,local_1a8,&local_278,1);
        uVar60 = uVar60 + 1;
        local_218._0_8_ = 0xbb67ae856a09e667;
        local_218._8_4_ = 0x3c6ef372;
        local_218._12_4_ = 0xa54ff53a;
        local_218._16_4_ = 0x510e527f;
        local_218._20_4_ = 0x9b05688c;
        local_218._24_4_ = 0x1f83d9ab;
        local_218._28_4_ = 0x5be0cd19;
        local_1b8 = 0;
        local_29c = (uint)local_290;
        uVar36 = (uint)uVar60;
        local_2a0 = uVar36 >> 0x18 | (uVar36 & 0xff0000) >> 8 | (uVar36 & 0xff00) << 8 |
                    uVar36 << 0x18;
        secp256k1_sha256_write((secp256k1_sha256 *)local_218,local_1a8,0x21);
        secp256k1_sha256_write((secp256k1_sha256 *)local_218,m,mlen);
        secp256k1_sha256_write((secp256k1_sha256 *)local_218,(uchar *)&local_29c,4);
        secp256k1_sha256_write((secp256k1_sha256 *)local_218,(uchar *)&local_2a0,4);
        secp256k1_sha256_finalize((secp256k1_sha256 *)local_218,local_1a8);
        secp256k1_scalar_set_b32(&local_238,local_1a8,&local_2a4);
        if (local_2a4 != 0) {
          return 0;
        }
        psVar49 = local_298 + 1;
        psVar47 = psVar47 + 1;
        if ((local_238.d[3] == 0 && local_238.d[1] == 0) &&
            (local_238.d[2] == 0 && local_238.d[0] == 0)) {
          return 0;
        }
      }
      local_298 = (secp256k1_scalar *)(local_288 * 0x20);
      puVar40 = (ulong *)((long)sec->d + (long)local_298->d);
      uVar60 = *puVar40;
      uVar39 = puVar40[1];
      uVar1 = puVar40[2];
      uVar2 = puVar40[3];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_238.d[0];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar60;
      uVar41 = SUB168(auVar3 * auVar19,8);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = uVar41;
      local_218._0_8_ = SUB168(auVar3 * auVar19,0);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_238.d[0];
      auVar20._8_8_ = 0;
      auVar20._0_8_ = uVar39;
      auVar4 = auVar4 * auVar20;
      uVar50 = SUB168(auVar4 + auVar35,0);
      uVar54 = SUB168(auVar4 + auVar35,8);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = local_238.d[1];
      auVar21._8_8_ = 0;
      auVar21._0_8_ = uVar60;
      uVar42 = SUB168(auVar5 * auVar21,8);
      uVar38 = SUB168(auVar5 * auVar21,0);
      local_218._8_8_ = uVar50 + uVar38;
      uVar38 = (ulong)CARRY8(uVar50,uVar38);
      uVar50 = uVar54 + uVar42;
      uVar55 = uVar50 + uVar38;
      uVar56 = (ulong)CARRY8(auVar4._8_8_,(ulong)CARRY8(uVar41,auVar4._0_8_)) +
               (ulong)(CARRY8(uVar54,uVar42) || CARRY8(uVar50,uVar38));
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_238.d[0];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar1;
      uVar43 = SUB168(auVar6 * auVar22,8);
      uVar38 = SUB168(auVar6 * auVar22,0);
      uVar41 = uVar55 + uVar38;
      uVar38 = (ulong)CARRY8(uVar55,uVar38);
      uVar42 = uVar56 + uVar43;
      uVar57 = uVar42 + uVar38;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_238.d[1];
      auVar23._8_8_ = 0;
      auVar23._0_8_ = uVar39;
      uVar44 = SUB168(auVar7 * auVar23,8);
      uVar50 = SUB168(auVar7 * auVar23,0);
      uVar55 = uVar41 + uVar50;
      uVar50 = (ulong)CARRY8(uVar41,uVar50);
      uVar54 = uVar57 + uVar44;
      uVar58 = uVar54 + uVar50;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_238.d[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar60;
      uVar45 = SUB168(auVar8 * auVar24,8);
      uVar41 = SUB168(auVar8 * auVar24,0);
      local_218._16_8_ = uVar55 + uVar41;
      uVar41 = (ulong)CARRY8(uVar55,uVar41);
      uVar55 = uVar58 + uVar45;
      uVar59 = uVar55 + uVar41;
      uVar58 = (ulong)(CARRY8(uVar56,uVar43) || CARRY8(uVar42,uVar38)) +
               (ulong)(CARRY8(uVar57,uVar44) || CARRY8(uVar54,uVar50)) +
               (ulong)(CARRY8(uVar58,uVar45) || CARRY8(uVar55,uVar41));
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_238.d[0];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar2;
      uVar44 = SUB168(auVar9 * auVar25,8);
      uVar38 = SUB168(auVar9 * auVar25,0);
      uVar41 = uVar59 + uVar38;
      uVar38 = (ulong)CARRY8(uVar59,uVar38);
      uVar42 = uVar58 + uVar44;
      uVar59 = uVar42 + uVar38;
      auVar10._8_8_ = 0;
      auVar10._0_8_ = local_238.d[1];
      auVar26._8_8_ = 0;
      auVar26._0_8_ = uVar1;
      uVar45 = SUB168(auVar10 * auVar26,8);
      uVar50 = SUB168(auVar10 * auVar26,0);
      uVar55 = uVar41 + uVar50;
      uVar50 = (ulong)CARRY8(uVar41,uVar50);
      uVar54 = uVar59 + uVar45;
      uVar51 = uVar54 + uVar50;
      auVar11._8_8_ = 0;
      auVar11._0_8_ = local_238.d[2];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = uVar39;
      uVar56 = SUB168(auVar11 * auVar27,8);
      uVar41 = SUB168(auVar11 * auVar27,0);
      uVar43 = uVar55 + uVar41;
      uVar41 = (ulong)CARRY8(uVar55,uVar41);
      uVar55 = uVar51 + uVar56;
      uVar52 = uVar55 + uVar41;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_238.d[3];
      auVar28._8_8_ = 0;
      auVar28._0_8_ = uVar60;
      uVar57 = SUB168(auVar12 * auVar28,8);
      uVar60 = SUB168(auVar12 * auVar28,0);
      local_218._24_8_ = uVar43 + uVar60;
      uVar60 = (ulong)CARRY8(uVar43,uVar60);
      uVar43 = uVar52 + uVar57;
      uVar53 = uVar43 + uVar60;
      uVar44 = (ulong)(CARRY8(uVar58,uVar44) || CARRY8(uVar42,uVar38)) +
               (ulong)(CARRY8(uVar59,uVar45) || CARRY8(uVar54,uVar50)) +
               (ulong)(CARRY8(uVar51,uVar56) || CARRY8(uVar55,uVar41)) +
               (ulong)(CARRY8(uVar52,uVar57) || CARRY8(uVar43,uVar60));
      auVar13._8_8_ = 0;
      auVar13._0_8_ = local_238.d[1];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = uVar2;
      uVar54 = SUB168(auVar13 * auVar29,8);
      uVar60 = SUB168(auVar13 * auVar29,0);
      uVar41 = uVar53 + uVar60;
      uVar60 = (ulong)CARRY8(uVar53,uVar60);
      uVar50 = uVar44 + uVar54;
      uVar45 = uVar50 + uVar60;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = local_238.d[2];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar1;
      uVar55 = SUB168(auVar14 * auVar30,8);
      uVar38 = SUB168(auVar14 * auVar30,0);
      uVar42 = uVar41 + uVar38;
      uVar38 = (ulong)CARRY8(uVar41,uVar38);
      uVar41 = uVar45 + uVar55;
      uVar56 = uVar41 + uVar38;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_238.d[3];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = uVar39;
      uVar43 = SUB168(auVar15 * auVar31,8);
      uVar39 = SUB168(auVar15 * auVar31,0);
      local_218._32_8_ = uVar42 + uVar39;
      uVar39 = (ulong)CARRY8(uVar42,uVar39);
      uVar42 = uVar56 + uVar43;
      uVar57 = uVar42 + uVar39;
      uVar54 = (ulong)(CARRY8(uVar44,uVar54) || CARRY8(uVar50,uVar60)) +
               (ulong)(CARRY8(uVar45,uVar55) || CARRY8(uVar41,uVar38)) +
               (ulong)(CARRY8(uVar56,uVar43) || CARRY8(uVar42,uVar39));
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_238.d[2];
      auVar32._8_8_ = 0;
      auVar32._0_8_ = uVar2;
      uVar50 = SUB168(auVar16 * auVar32,8);
      uVar60 = SUB168(auVar16 * auVar32,0);
      uVar42 = uVar57 + uVar60;
      uVar60 = (ulong)CARRY8(uVar57,uVar60);
      uVar38 = uVar54 + uVar50;
      uVar55 = uVar38 + uVar60;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_238.d[3];
      auVar33._8_8_ = 0;
      auVar33._0_8_ = uVar1;
      uVar41 = SUB168(auVar17 * auVar33,8);
      uVar39 = SUB168(auVar17 * auVar33,0);
      local_218._40_8_ = uVar42 + uVar39;
      uVar39 = (ulong)CARRY8(uVar42,uVar39);
      uVar1 = uVar55 + uVar41;
      local_218._56_8_ =
           (ulong)(CARRY8(uVar54,uVar50) || CARRY8(uVar38,uVar60)) +
           (ulong)(CARRY8(uVar55,uVar41) || CARRY8(uVar1,uVar39));
      local_218._48_8_ = uVar1 + uVar39;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_238.d[3];
      auVar34._8_8_ = 0;
      auVar34._0_8_ = uVar2;
      local_218._48_16_ = auVar18 * auVar34 + local_218._48_16_;
      secp256k1_scalar_reduce_512(psVar49,(uint64_t *)local_218);
      secp256k1_scalar_negate(psVar49,psVar49);
      iVar37 = secp256k1_scalar_add
                         (psVar49,psVar49,
                          (secp256k1_scalar *)((long)local_268->d + (long)local_298->d));
      auVar62._0_4_ = -(uint)((int)psVar49->d[2] == 0 && (int)psVar49->d[0] == 0);
      auVar62._4_4_ =
           -(uint)(*(int *)((long)psVar49->d + 0x14) == 0 && *(int *)((long)psVar49->d + 4) == 0);
      auVar62._8_4_ = -(uint)((int)psVar49->d[3] == 0 && (int)psVar49->d[1] == 0);
      auVar62._12_4_ =
           -(uint)(*(int *)((long)psVar49->d + 0x1c) == 0 && *(int *)((long)psVar49->d + 0xc) == 0);
      iVar37 = movmskps(iVar37,auVar62);
      if (iVar37 == 0xf) {
        return 0;
      }
      psVar61 = (secp256k1_ecmult_gen_context *)
                ((long)(local_280->blind).d + (rsizes[local_288] - 8));
      local_288 = local_288 + 1;
      data = local_270;
    } while (local_288 != nrings);
  }
  return 1;
}

Assistant:

int secp256k1_borromean_sign(const secp256k1_ecmult_context* ecmult_ctx, const secp256k1_ecmult_gen_context *ecmult_gen_ctx,
 unsigned char *e0, secp256k1_scalar *s, const secp256k1_gej *pubs, const secp256k1_scalar *k, const secp256k1_scalar *sec,
 const size_t *rsizes, const size_t *secidx, size_t nrings, const unsigned char *m, size_t mlen) {
    secp256k1_gej rgej;
    secp256k1_ge rge;
    secp256k1_scalar ens;
    secp256k1_sha256 sha256_e0;
    unsigned char tmp[33];
    size_t i;
    size_t j;
    size_t count;
    size_t size;
    int overflow;
    VERIFY_CHECK(ecmult_ctx != NULL);
    VERIFY_CHECK(ecmult_gen_ctx != NULL);
    VERIFY_CHECK(e0 != NULL);
    VERIFY_CHECK(s != NULL);
    VERIFY_CHECK(pubs != NULL);
    VERIFY_CHECK(k != NULL);
    VERIFY_CHECK(sec != NULL);
    VERIFY_CHECK(rsizes != NULL);
    VERIFY_CHECK(secidx != NULL);
    VERIFY_CHECK(nrings > 0);
    VERIFY_CHECK(m != NULL);
    secp256k1_sha256_initialize(&sha256_e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_ecmult_gen(ecmult_gen_ctx, &rgej, &k[i]);
        secp256k1_ge_set_gej(&rge, &rgej);
        if (secp256k1_gej_is_infinity(&rgej)) {
            return 0;
        }
        secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        for (j = secidx[i] + 1; j < rsizes[i]; j++) {
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
            /** The signing algorithm as a whole is not memory uniform so there is likely a cache sidechannel that
             *  leaks which members are non-forgeries. That the forgeries themselves are variable time may leave
             *  an additional privacy impacting timing side-channel, but not a key loss one.
             */
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
        }
        secp256k1_sha256_write(&sha256_e0, tmp, size);
        count += rsizes[i];
    }
    secp256k1_sha256_write(&sha256_e0, m, mlen);
    secp256k1_sha256_finalize(&sha256_e0, e0);
    count = 0;
    for (i = 0; i < nrings; i++) {
        VERIFY_CHECK(INT_MAX - count > rsizes[i]);
        secp256k1_borromean_hash(tmp, m, mlen, e0, 32, i, 0);
        secp256k1_scalar_set_b32(&ens, tmp, &overflow);
        if (overflow || secp256k1_scalar_is_zero(&ens)) {
            return 0;
        }
        for (j = 0; j < secidx[i]; j++) {
            secp256k1_ecmult(ecmult_ctx, &rgej, &pubs[count + j], &ens, &s[count + j]);
            if (secp256k1_gej_is_infinity(&rgej)) {
                return 0;
            }
            secp256k1_ge_set_gej_var(&rge, &rgej);
            secp256k1_eckey_pubkey_serialize(&rge, tmp, &size, 1);
            secp256k1_borromean_hash(tmp, m, mlen, tmp, 33, i, j + 1);
            secp256k1_scalar_set_b32(&ens, tmp, &overflow);
            if (overflow || secp256k1_scalar_is_zero(&ens)) {
                return 0;
            }
        }
        secp256k1_scalar_mul(&s[count + j], &ens, &sec[i]);
        secp256k1_scalar_negate(&s[count + j], &s[count + j]);
        secp256k1_scalar_add(&s[count + j], &s[count + j], &k[i]);
        if (secp256k1_scalar_is_zero(&s[count + j])) {
            return 0;
        }
        count += rsizes[i];
    }
    secp256k1_scalar_clear(&ens);
    secp256k1_ge_clear(&rge);
    secp256k1_gej_clear(&rgej);
    memset(tmp, 0, 33);
    return 1;
}